

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall
Sampling_PermutationElement_Test::~Sampling_PermutationElement_Test
          (Sampling_PermutationElement_Test *this)

{
  void *in_RDI;
  
  ~Sampling_PermutationElement_Test((Sampling_PermutationElement_Test *)0x654f58);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Sampling, PermutationElement) {
    for (int len = 2; len < 1024; ++len) {
        for (int iter = 0; iter < 10; ++iter) {
            std::vector<bool> seen(len, false);

            for (int i = 0; i < len; ++i) {
                int offset = PermutationElement(i, len, iter);
                ASSERT_TRUE(offset >= 0 && offset < seen.size()) << offset;
                EXPECT_FALSE(seen[offset]);
                seen[offset] = true;
            }
        }
    }
}